

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_subquery.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::Binder::PlanSubquery
          (Binder *this,BoundSubqueryExpression *expr,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *root)

{
  char cVar1;
  ExpressionType EVar2;
  _func_int **pp_Var3;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var4;
  _func_int *p_Var5;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> _Var6;
  pointer puVar7;
  _Head_base<0UL,_duckdb::LogicalAggregate_*,_false> _Var8;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> _Var9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  bool bVar12;
  Binder *pBVar13;
  pointer pLVar14;
  pointer pLVar15;
  reference pvVar16;
  pointer this_00;
  pointer pBVar17;
  pointer pLVar18;
  pointer pLVar19;
  idx_t iVar20;
  ClientConfig *pCVar21;
  pointer pEVar22;
  pointer pBVar23;
  pointer puVar24;
  pointer pLVar25;
  reference pvVar26;
  reference pvVar27;
  type op;
  NotImplementedException *this_01;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RCX;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var28;
  LogicalType *pLVar29;
  vector<duckdb::CorrelatedColumnInfo,_true> *correlated_columns;
  ulong __n;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_588;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> local_580;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_578;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_570;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  error_children;
  idx_t projection_index;
  idx_t aggr_index;
  _Head_base<0UL,_duckdb::LogicalAggregate_*,_false> local_530;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_528;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_520;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_518;
  _func_int **local_510;
  LogicalType idx_type;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_4f0;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> local_4e8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_4e0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  aggregate_list;
  undefined1 local_4b8 [8];
  idx_t aggregate_index;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  proj_expressions;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_488;
  pointer puStack_480;
  pointer local_478;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  projection_list;
  undefined1 local_450 [16];
  ClientContext *local_440;
  FunctionBinder function_binder_1;
  FunctionBinder function_binder;
  shared_ptr<duckdb::Binder,_true> sub_binder;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  count_children;
  AggregateFunction count_star_fun;
  ColumnBinding local_188;
  __node_base_ptr local_178;
  value_type plan_column;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150 [18];
  
  CreateBinder((Binder *)&sub_binder,
               (ClientContext *)(expr->super_Expression).super_BaseExpression.alias._M_dataplus._M_p
               ,(optional_ptr<duckdb::Binder,_true>)expr,REGULAR_BINDER);
  pBVar13 = shared_ptr<duckdb::Binder,_true>::operator->(&sub_binder);
  pBVar13->is_outside_flattened = false;
  pBVar13 = shared_ptr<duckdb::Binder,_true>::operator->(&sub_binder);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)(root + 0xd));
  CreatePlan((Binder *)local_450,(BoundQueryNode *)pBVar13);
  uVar10 = local_450._0_8_;
  local_450._0_8_ = (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  bVar12 = BoundSubqueryExpression::IsCorrelated((BoundSubqueryExpression *)root);
  if (bVar12) {
    local_578._M_head_impl = (LogicalOperator *)uVar10;
    pBVar13 = shared_ptr<duckdb::Binder,_true>::operator->
                        ((shared_ptr<duckdb::Binder,_true> *)(root + 0xb));
    correlated_columns = &pBVar13->correlated_columns;
    bVar12 = true;
    if (*(char *)&root[0xe].
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl == '\x04') {
LAB_00a61726:
      iVar20 = GenerateTableIndex((Binder *)expr);
      error_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(in_RCX->
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    )._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (in_RCX->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      CreateDuplicateEliminatedJoin
                ((duckdb *)&count_children,correlated_columns,MARK,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&error_children,bVar12);
      if (error_children.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)&((((error_children.
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       )._M_t.
                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                       .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                     super_BaseExpression).type)();
      }
      pLVar14 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)&count_children);
      pLVar14->subquery_type = ANY;
      pLVar14 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)&count_children);
      (pLVar14->super_LogicalComparisonJoin).super_LogicalJoin.mark_index = iVar20;
      pLVar14 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)&count_children);
      pLVar14->any_join = true;
      if (8 < (ulong)((long)root[0x10].
                            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl -
                     (long)root[0xf].
                           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)) {
        this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&count_star_fun,
                   "Correlated IN/ANY/ALL with multiple columns not yet supported",
                   (allocator *)&plan_column);
        NotImplementedException::NotImplementedException(this_01,(string *)&count_star_fun);
        __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pLVar14 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)&count_children);
      std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::_M_move_assign((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        *)&pLVar14->expression_children,root + 0xf);
      pLVar14 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)&count_children);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                (&(pLVar14->child_types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(root + 0x13))
      ;
      pLVar14 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)&count_children);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                (&(pLVar14->child_targets).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(root + 0x16))
      ;
      EVar2 = *(ExpressionType *)
               &root[0x12].
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      pLVar14 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)&count_children);
      pLVar14->comparison_type = EVar2;
      pLVar14 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)&count_children);
      idx_type._0_8_ = local_578._M_head_impl;
      local_578._M_head_impl = (LogicalOperator *)0x0;
      LogicalOperator::AddChild
                ((LogicalOperator *)pLVar14,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&idx_type);
      if (idx_type._0_8_ != 0) {
        (**(code **)(*(long *)idx_type._0_8_ + 8))();
      }
      puVar24 = count_children.
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      idx_type.id_ = INVALID;
      idx_type.physical_type_ = ~INVALID;
      idx_type._2_6_ = 0;
      count_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      _Var28._M_head_impl =
           (in_RCX->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (in_RCX->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)puVar24;
      if (_Var28._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var28._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      (*(code *)(((root->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                expressions).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)(&count_star_fun,root);
      plan_column.column_index = 0;
      plan_column.table_index = iVar20;
      make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding>
                ((duckdb *)&aggregate_list,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &count_star_fun,(LogicalType *)(root + 7),&plan_column);
    }
    else {
      bVar12 = PerformDuplicateElimination((Binder *)expr,correlated_columns);
      cVar1 = *(char *)&root[0xe].
                        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      if (cVar1 == '\x02') {
        iVar20 = GenerateTableIndex((Binder *)expr);
        error_children.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(in_RCX->
                      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      )._M_t.
                      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (in_RCX->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)0x0;
        CreateDuplicateEliminatedJoin
                  ((duckdb *)&count_children,correlated_columns,MARK,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&error_children,bVar12);
        if (error_children.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)&((((error_children.
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                         )._M_t.
                         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                       super_BaseExpression).type)();
        }
        pLVar14 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                                *)&count_children);
        pLVar14->subquery_type = EXISTS;
        pLVar14 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                                *)&count_children);
        (pLVar14->super_LogicalComparisonJoin).super_LogicalJoin.mark_index = iVar20;
        pLVar14 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                                *)&count_children);
        pLVar14->any_join = true;
        pLVar14 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                                *)&count_children);
        idx_type._0_8_ = local_578._M_head_impl;
        local_578._M_head_impl = (LogicalOperator *)0x0;
        LogicalOperator::AddChild
                  ((LogicalOperator *)pLVar14,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&idx_type);
        if (idx_type._0_8_ != 0) {
          (**(code **)(*(long *)idx_type._0_8_ + 8))();
        }
        puVar24 = count_children.
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        idx_type.id_ = INVALID;
        idx_type.physical_type_ = ~INVALID;
        idx_type._2_6_ = 0;
        count_children.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        _Var28._M_head_impl =
             (in_RCX->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (in_RCX->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)puVar24;
        if (_Var28._M_head_impl != (LogicalOperator *)0x0) {
          (**(code **)((long)(_Var28._M_head_impl)->_vptr_LogicalOperator + 8))();
        }
        (*(code *)(((root->
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    )._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                  expressions).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage)(&count_star_fun,root);
        plan_column.column_index = 0;
        plan_column.table_index = iVar20;
        make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding>
                  ((duckdb *)&aggregate_list,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &count_star_fun,(LogicalType *)(root + 7),&plan_column);
      }
      else {
        if (cVar1 != '\x01') goto LAB_00a61726;
        error_children.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(in_RCX->
                      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      )._M_t.
                      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (in_RCX->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)0x0;
        CreateDuplicateEliminatedJoin
                  ((duckdb *)&count_children,correlated_columns,SINGLE,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&error_children,bVar12);
        if (error_children.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)&((((error_children.
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                         )._M_t.
                         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                       super_BaseExpression).type)();
        }
        pLVar14 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                                *)&count_children);
        pLVar14->subquery_type = SCALAR;
        pLVar14 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                                *)&count_children);
        pLVar14->any_join = false;
        pLVar15 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                                *)&local_578);
        (*pLVar15->_vptr_LogicalOperator[2])(&count_star_fun,pLVar15);
        pvVar16 = vector<duckdb::ColumnBinding,_true>::back
                            ((vector<duckdb::ColumnBinding,_true> *)&count_star_fun);
        plan_column.table_index = pvVar16->table_index;
        plan_column.column_index = pvVar16->column_index;
        ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
        ~_Vector_base((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *
                      )&count_star_fun);
        pLVar14 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                                *)&count_children);
        idx_type._0_8_ = local_578._M_head_impl;
        local_578._M_head_impl = (LogicalOperator *)0x0;
        LogicalOperator::AddChild
                  ((LogicalOperator *)pLVar14,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&idx_type);
        if (idx_type._0_8_ != 0) {
          (**(code **)(*(long *)idx_type._0_8_ + 8))();
        }
        puVar24 = count_children.
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        idx_type.id_ = INVALID;
        idx_type.physical_type_ = ~INVALID;
        idx_type._2_6_ = 0;
        count_children.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        _Var28._M_head_impl =
             (in_RCX->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (in_RCX->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)puVar24;
        if (_Var28._M_head_impl != (LogicalOperator *)0x0) {
          (**(code **)((long)(_Var28._M_head_impl)->_vptr_LogicalOperator + 8))();
        }
        (*(code *)(((root->
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    )._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                  expressions).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage)(&count_star_fun,root);
        make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding&>
                  ((duckdb *)&aggregate_list,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &count_star_fun,(LogicalType *)(root + 7),&plan_column);
      }
    }
    puVar24 = aggregate_list.
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    aggregate_list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ::std::__cxx11::string::~string((string *)&count_star_fun);
    if (count_children.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)&((((count_children.
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                   super_BaseExpression).type)();
    }
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)puVar24;
    if (local_578._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_578._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    local_578._M_head_impl = (LogicalOperator *)0x0;
    goto LAB_00a62619;
  }
  local_588._M_head_impl = (BoundConstantExpression *)uVar10;
  cVar1 = *(char *)&root[0xe].
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  if (cVar1 == '\x01') {
    pLVar15 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)&local_588);
    (*pLVar15->_vptr_LogicalOperator[2])(&idx_type);
    pvVar16 = vector<duckdb::ColumnBinding,_true>::get<true>
                        ((vector<duckdb::ColumnBinding,_true> *)&idx_type,0);
    pp_Var3 = (_func_int **)pvVar16->table_index;
    pCVar21 = ClientConfig::GetConfig
                        ((ClientContext *)
                         (expr->super_Expression).super_BaseExpression.alias._M_dataplus._M_p);
    bVar12 = pCVar21->scalar_subquery_error_on_multiple_rows;
    aggregate_list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    aggregate_list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    aggregate_list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pLVar29 = (LogicalType *)(root + 7);
    count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_dataplus.
    _M_p = (pointer)0x0;
    count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         pp_Var3;
    make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType&,duckdb::ColumnBinding>
              ((duckdb *)&local_510,pLVar29,(ColumnBinding *)&count_star_fun);
    count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         local_510;
    projection_list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_510 = (_func_int **)0x0;
    projection_list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    projection_list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&projection_list,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &count_star_fun);
    if (count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function
        != (_func_int **)0x0) {
      (**(code **)(*count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                    _vptr_Function + 8))();
    }
    FunctionBinder::FunctionBinder(&function_binder_1,(Binder *)expr);
    FirstFunctionGetter::GetFunction(&count_star_fun,pLVar29);
    function_binder.binder.ptr =
         (Binder *)
         projection_list.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    function_binder.context =
         (ClientContext *)
         projection_list.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    projection_list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    projection_list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    projection_list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_530._M_head_impl = (LogicalAggregate *)0x0;
    FunctionBinder::BindAggregateFunction
              ((FunctionBinder *)&aggregate_index,(AggregateFunction *)&function_binder_1,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)&count_star_fun,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &function_binder,(AggregateType)&local_530);
    if (local_530._M_head_impl != (LogicalAggregate *)0x0) {
      (*((local_530._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
    }
    local_530._M_head_impl = (LogicalAggregate *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&function_binder);
    AggregateFunction::~AggregateFunction(&count_star_fun);
    plan_column.table_index = aggregate_index;
    aggregate_index = 0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&aggregate_list,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &plan_column);
    if (plan_column.table_index != 0) {
      (**(code **)(*(long *)plan_column.table_index + 8))();
    }
    if (bVar12 != false) {
      count_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      count_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      count_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      CountStarFun::GetFunction();
      local_188.table_index =
           (idx_t)count_children.
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_188.column_index =
           (idx_t)count_children.
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_178 = (__node_base_ptr)
                  count_children.
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      count_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      count_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      count_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_518._M_head_impl = (LogicalOperator *)0x0;
      FunctionBinder::BindAggregateFunction
                ((FunctionBinder *)&error_children,(AggregateFunction *)&function_binder_1,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)&plan_column,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_188,(AggregateType)&local_518);
      if (local_518._M_head_impl != (LogicalOperator *)0x0) {
        (*(local_518._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      local_518._M_head_impl = (LogicalOperator *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_188);
      AggregateFunction::~AggregateFunction((AggregateFunction *)&plan_column);
      local_488._M_head_impl =
           (LogicalOperator *)
           error_children.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      error_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&aggregate_list,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_488);
      if (local_488._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)&(((((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *
                         )&(local_488._M_head_impl)->_vptr_LogicalOperator)->_M_t).
                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                       .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                     super_BaseExpression).type)();
      }
      if (error_children.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)&((((error_children.
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       )._M_t.
                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                       .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                     super_BaseExpression).type)();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&count_children);
    }
    aggr_index = GenerateTableIndex((Binder *)expr);
    count_children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)GenerateTableIndex((Binder *)expr);
    make_uniq<duckdb::LogicalAggregate,unsigned_long,unsigned_long&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
              ((duckdb *)&local_520,(unsigned_long *)&count_children,&aggr_index,&aggregate_list);
    pLVar18 = unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
              ::operator->((unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                            *)&local_520);
    local_528._M_head_impl = (LogicalOperator *)local_588._M_head_impl;
    local_588._M_head_impl = (BoundConstantExpression *)0x0;
    LogicalOperator::AddChild
              (&pLVar18->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_528);
    if ((element_type *)local_528._M_head_impl != (element_type *)0x0) {
      (**(code **)((long)((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                           *)&(((enable_shared_from_this<duckdb::Binder> *)
                               &(local_528._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).
                              internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->super__Head_base<0UL,_duckdb::Expression_*,_false> + 8))();
    }
    _Var9._M_head_impl = local_520._M_head_impl;
    _Var6._M_head_impl = local_588._M_head_impl;
    local_528._M_head_impl = (LogicalOperator *)0x0;
    local_520._M_head_impl = (BoundConstantExpression *)0x0;
    local_588._M_head_impl = _Var9._M_head_impl;
    if (_Var6._M_head_impl != (BoundConstantExpression *)0x0) {
      (*((_Var6._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
    }
    if (bVar12 != false) {
      projection_index = GenerateTableIndex((Binder *)expr);
      pLVar15 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)&local_588);
      pvVar26 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::get<true>(&pLVar15->expressions,0);
      pEVar22 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar26);
      count_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)aggr_index;
      count_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType&,duckdb::ColumnBinding>
                ((duckdb *)&local_580,&pEVar22->return_type,(ColumnBinding *)&count_children);
      pLVar15 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)&local_588);
      pvVar26 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::get<true>(&pLVar15->expressions,1);
      pEVar22 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar26);
      count_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)aggr_index;
      count_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
      make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType&,duckdb::ColumnBinding>
                ((duckdb *)&local_570,&pEVar22->return_type,(ColumnBinding *)&count_children);
      Value::BIGINT((Value *)&count_children,1);
      make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                ((duckdb *)&local_4e0,(Value *)&count_children);
      Value::~Value((Value *)&count_children);
      count_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(count_children.
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,0x1c);
      make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<duckdb::BoundColumnRefExpression>,true>,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
                ((duckdb *)&local_4e8,(ExpressionType *)&count_children,
                 (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                  *)&local_570,
                 (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                  *)&local_4e0);
      error_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      error_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      error_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Value::Value((Value *)&count_children,
                   "More than one row returned by a subquery used as an expression - scalar subqueries can only return a single row.\n\nUse \"SET scalar_subquery_error_on_multiple_rows=false\" to revert to previous behavior of returning a random row."
                  );
      make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                ((duckdb *)&proj_expressions,(Value *)&count_children);
      local_488._M_head_impl =
           (LogicalOperator *)
           proj_expressions.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      proj_expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&error_children,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_488);
      if (local_488._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                              *)&(local_488._M_head_impl)->_vptr_LogicalOperator)->_M_t).
                           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                           .super__Head_base<0UL,_duckdb::Expression_*,_false> + 8))();
      }
      local_488._M_head_impl = (LogicalOperator *)0x0;
      if (proj_expressions.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)&((((proj_expressions.
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       )._M_t.
                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                       .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                     super_BaseExpression).type)();
      }
      proj_expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      Value::~Value((Value *)&count_children);
      ErrorFun::GetFunction();
      local_488._M_head_impl =
           (LogicalOperator *)
           error_children.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      puStack_480 = error_children.
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      local_478 = error_children.
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      error_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      error_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      error_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      FunctionBinder::BindScalarFunction
                ((FunctionBinder *)local_4b8,(ScalarFunction *)&function_binder_1,&count_children,
                 SUB81(&local_488,0),(optional_ptr<duckdb::Binder,_true>)0x0);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_488);
      ScalarFunction::~ScalarFunction((ScalarFunction *)&count_children);
      pBVar23 = unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                              *)&local_580);
      pEVar22 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_4b8);
      LogicalType::operator=(&pEVar22->return_type,&(pBVar23->super_Expression).return_type);
      make_uniq<duckdb::BoundCaseExpression,duckdb::unique_ptr<duckdb::BoundComparisonExpression,std::default_delete<duckdb::BoundComparisonExpression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<duckdb::BoundColumnRefExpression>,true>>
                ((duckdb *)&local_440,
                 (unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
                  *)&local_4e8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_4b8,
                 (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                  *)&local_580);
      local_4f0._M_head_impl = (Expression *)local_440;
      proj_expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_440 = (ClientContext *)0x0;
      proj_expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      proj_expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&proj_expressions,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_4f0);
      if ((ClientContext *)local_4f0._M_head_impl != (ClientContext *)0x0) {
        (*(code *)(((((weak_ptr<duckdb::ClientContext,_true> *)
                     &((local_4f0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                    internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                  internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)();
      }
      make_uniq<duckdb::LogicalProjection,unsigned_long&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
                ((duckdb *)&local_4f0,&projection_index,&proj_expressions);
      pLVar19 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                              *)&local_4f0);
      local_450._8_8_ = local_588._M_head_impl;
      local_588._M_head_impl = (BoundConstantExpression *)0x0;
      LogicalOperator::AddChild
                (&pLVar19->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)(local_450 + 8));
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_450._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*(*(_func_int ***)local_450._8_8_)[1])();
      }
      _Var4._M_head_impl = local_4f0._M_head_impl;
      _Var6._M_head_impl = local_588._M_head_impl;
      local_450._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_4f0._M_head_impl = (Expression *)0x0;
      local_588._M_head_impl = (BoundConstantExpression *)_Var4._M_head_impl;
      if (_Var6._M_head_impl == (BoundConstantExpression *)0x0) {
        aggr_index = projection_index;
      }
      else {
        (*((_Var6._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
        aggr_index = projection_index;
        if (local_4f0._M_head_impl != (Expression *)0x0) {
          (*((local_4f0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&proj_expressions);
      if (local_440 != (ClientContext *)0x0) {
        (*(code *)(((local_440->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                    internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                  internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)();
      }
      if (local_4b8 != (undefined1  [8])0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_4b8)->__weak_this_).internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&error_children);
      if (local_4e8._M_head_impl != (LogicalProjection *)0x0) {
        (*((local_4e8._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
      }
      if (local_4e0._M_head_impl != (LogicalOperator *)0x0) {
        (*(local_4e0._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      if ((element_type *)local_570._M_head_impl != (element_type *)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                     &(local_570._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      if (local_580._M_head_impl != (LogicalProjection *)0x0) {
        (*((local_580._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
      }
    }
    projection_index =
         (idx_t)(in_RCX->
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RCX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    local_580._M_head_impl = (LogicalProjection *)local_588._M_head_impl;
    local_588._M_head_impl = (BoundConstantExpression *)0x0;
    LogicalCrossProduct::Create
              ((LogicalCrossProduct *)&error_children,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&projection_index,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_580);
    puVar24 = error_children.
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    error_children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var28._M_head_impl =
         (in_RCX->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RCX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (LogicalOperator *)puVar24;
    if (_Var28._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var28._M_head_impl)->_vptr_LogicalOperator + 8))();
      if (error_children.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)&((((error_children.
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       )._M_t.
                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                       .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                     super_BaseExpression).type)();
      }
    }
    error_children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    if ((ClientContext *)local_580._M_head_impl != (ClientContext *)0x0) {
      (*(code *)(((((weak_ptr<duckdb::ClientContext,_true> *)
                   &((local_580._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator)->
                  internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)();
    }
    local_580._M_head_impl = (LogicalProjection *)0x0;
    if (projection_index != 0) {
      (**(code **)(*(long *)projection_index + 8))();
    }
    projection_index = 0;
    (*(code *)(((root->
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->expressions)
              .
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)(&error_children,root);
    proj_expressions.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)aggr_index;
    proj_expressions.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding>
              ((duckdb *)&local_570,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error_children,
               pLVar29,(ColumnBinding *)&proj_expressions);
    _Var28._M_head_impl = local_570._M_head_impl;
    local_570._M_head_impl = (LogicalOperator *)0x0;
    ::std::__cxx11::string::~string((string *)&error_children);
    if ((ClientContext *)local_520._M_head_impl != (ClientContext *)0x0) {
      (*(code *)(((((original *)
                   &((local_520._M_head_impl)->super_Expression).super_BaseExpression.
                    _vptr_BaseExpression)->
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)();
    }
    if (aggregate_index != 0) {
      (**(code **)(*(long *)aggregate_index + 8))();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&projection_list);
    if (local_510 != (_func_int **)0x0) {
      (**(code **)(*local_510 + 8))();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&aggregate_list);
    pLVar29 = &idx_type;
LAB_00a625fb:
    ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
    ~_Vector_base((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
                  pLVar29);
  }
  else {
    if (cVar1 != '\x02') {
      pLVar15 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)&local_588);
      (*pLVar15->_vptr_LogicalOperator[2])(&plan_column,pLVar15);
      puVar24 = (pointer)GenerateTableIndex((Binder *)expr);
      count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)
           CONCAT71(count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                    _vptr_Function._1_7_,7);
      make_uniq<duckdb::LogicalComparisonJoin,duckdb::JoinType>
                ((duckdb *)&error_children,(JoinType *)&count_star_fun);
      pLVar25 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)&error_children);
      (pLVar25->super_LogicalJoin).mark_index = (idx_t)puVar24;
      pLVar25 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)&error_children);
      idx_type._0_8_ =
           (in_RCX->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (in_RCX->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      LogicalOperator::AddChild
                ((LogicalOperator *)pLVar25,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&idx_type);
      if (idx_type._0_8_ != 0) {
        (**(code **)(*(long *)idx_type._0_8_ + 8))();
      }
      idx_type.id_ = INVALID;
      idx_type.physical_type_ = ~INVALID;
      idx_type._2_6_ = 0;
      pLVar25 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)&error_children);
      aggregate_list.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_588._M_head_impl;
      local_588._M_head_impl = (BoundConstantExpression *)0x0;
      LogicalOperator::AddChild
                ((LogicalOperator *)pLVar25,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&aggregate_list);
      if (aggregate_list.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)&((((aggregate_list.
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       )._M_t.
                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                       .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                     super_BaseExpression).type)();
      }
      aggregate_list.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      for (__n = 0; puVar7 = error_children.
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
          __n < (ulong)((long)root[0x10].
                              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                        - (long)root[0xf].
                                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                _M_head_impl >> 3); __n = __n + 1) {
        count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)0x0;
        count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_dataplus
        ._M_p = (pointer)0x0;
        pvVar26 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                               *)(root + 0xf),__n);
        _Var4._M_head_impl =
             (pvVar26->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar26->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        if (count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function.
            _vptr_Function != (_func_int **)0x0) {
          p_Var5 = *count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                    _vptr_Function;
          count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function
               = (_func_int **)_Var4._M_head_impl;
          (**(code **)(p_Var5 + 8))();
          _Var4._M_head_impl =
               (Expression *)
               count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function.
               _vptr_Function;
        }
        count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)_Var4._M_head_impl;
        pvVar27 = vector<duckdb::LogicalType,_true>::get<true>
                            ((vector<duckdb::LogicalType,_true> *)(root + 0x13),__n);
        pvVar16 = vector<duckdb::ColumnBinding,_true>::get<true>
                            ((vector<duckdb::ColumnBinding,_true> *)&plan_column,__n);
        make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType&,duckdb::ColumnBinding&>
                  ((duckdb *)&function_binder,pvVar27,pvVar16);
        projection_list.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)function_binder.binder;
        function_binder.binder.ptr = (Binder *)0x0;
        pvVar27 = vector<duckdb::LogicalType,_true>::get<true>
                            ((vector<duckdb::LogicalType,_true> *)(root + 0x16),__n);
        BoundCastExpression::AddDefaultCastToType
                  ((BoundCastExpression *)&count_children,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &projection_list,pvVar27,false);
        _Var11 = count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
                 _M_dataplus;
        count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_dataplus
        ._M_p = (pointer)count_children.
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        count_children.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        if (_Var11._M_p != (pointer)0x0) {
          (**(code **)(*(long *)_Var11._M_p + 8))();
          if (count_children.
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)&((((count_children.
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                           )._M_t.
                           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                           .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                         super_BaseExpression).type)();
          }
        }
        count_children.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        if (projection_list.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)&((((projection_list.
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                         )._M_t.
                         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                       super_BaseExpression).type)();
        }
        projection_list.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        if (function_binder.binder.ptr != (Binder *)0x0) {
          (*(code *)((((function_binder.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).
                      __weak_this_.internal.
                      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
        count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
        _M_string_length =
             CONCAT71(count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                      name._M_string_length._1_7_,
                      *(undefined1 *)
                       &root[0x12].
                        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl);
        pLVar25 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                *)&error_children);
        ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
        emplace_back<duckdb::JoinCondition>
                  (&(pLVar25->conditions).
                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
                   (JoinCondition *)&count_star_fun);
        JoinCondition::~JoinCondition((JoinCondition *)&count_star_fun);
      }
      error_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      _Var28._M_head_impl =
           (in_RCX->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (in_RCX->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)puVar7;
      if (_Var28._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var28._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      (*(code *)(((root->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                expressions).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)(&count_star_fun,root);
      count_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      count_children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = puVar24;
      make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding>
                ((duckdb *)&function_binder,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &count_star_fun,(LogicalType *)(root + 7),(ColumnBinding *)&count_children);
      _Var28._M_head_impl = (LogicalOperator *)function_binder.binder;
      function_binder.binder.ptr = (Binder *)0x0;
      ::std::__cxx11::string::~string((string *)&count_star_fun);
      if (error_children.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)&((((error_children.
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       )._M_t.
                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                       .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                     super_BaseExpression).type)();
      }
      pLVar29 = (LogicalType *)&plan_column;
      goto LAB_00a625fb;
    }
    BoundLimitNode::ConstantValue((BoundLimitNode *)&count_star_fun,1);
    BoundLimitNode::BoundLimitNode((BoundLimitNode *)&plan_column);
    make_uniq<duckdb::LogicalLimit,duckdb::BoundLimitNode,duckdb::BoundLimitNode>
              ((duckdb *)&local_488,(BoundLimitNode *)&count_star_fun,(BoundLimitNode *)&plan_column
              );
    if ((_Hash_node_base *)local_150[0]._0_8_ != (_Hash_node_base *)0x0) {
      (*(code *)(*(_Hash_node_base **)local_150[0]._0_8_)[1]._M_nxt)();
    }
    if (count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.field_2.
        _M_allocated_capacity != 0) {
      (**(code **)(*(long *)count_star_fun.super_BaseScalarFunction.super_SimpleFunction.
                            super_Function.name.field_2._M_allocated_capacity + 8))();
    }
    this_00 = unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>::
              operator->((unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>
                          *)&local_488);
    proj_expressions.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_588._M_head_impl;
    local_588._M_head_impl = (BoundConstantExpression *)0x0;
    LogicalOperator::AddChild
              (&this_00->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&proj_expressions);
    if (proj_expressions.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)&((((proj_expressions.
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                   super_BaseExpression).type)();
    }
    _Var28._M_head_impl = local_488._M_head_impl;
    _Var6._M_head_impl = local_588._M_head_impl;
    proj_expressions.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_488._M_head_impl = (LogicalOperator *)0x0;
    local_588._M_head_impl = (BoundConstantExpression *)_Var28._M_head_impl;
    if (_Var6._M_head_impl != (BoundConstantExpression *)0x0) {
      (*((_Var6._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
    }
    CountStarFun::GetFunction();
    FunctionBinder::FunctionBinder(&function_binder,(Binder *)expr);
    AggregateFunction::AggregateFunction((AggregateFunction *)&plan_column,&count_star_fun);
    error_children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    error_children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    error_children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_510 = (_func_int **)0x0;
    FunctionBinder::BindAggregateFunction
              (&function_binder_1,(AggregateFunction *)&function_binder,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)&plan_column,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &error_children,(AggregateType)&local_510);
    if (local_510 != (_func_int **)0x0) {
      (**(code **)(*local_510 + 8))();
    }
    local_510 = (_func_int **)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&error_children);
    AggregateFunction::~AggregateFunction((AggregateFunction *)&plan_column);
    pBVar17 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                            *)&function_binder_1);
    LogicalType::LogicalType(&idx_type,&(pBVar17->super_Expression).return_type);
    count_children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)function_binder_1.binder;
    aggregate_list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    function_binder_1.binder.ptr = (Binder *)0x0;
    aggregate_list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    aggregate_list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&aggregate_list,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &count_children);
    if (count_children.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)&((((count_children.
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                   super_BaseExpression).type)();
    }
    aggregate_index = GenerateTableIndex((Binder *)expr);
    count_children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)GenerateTableIndex((Binder *)expr);
    make_uniq<duckdb::LogicalAggregate,unsigned_long,unsigned_long&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
              ((duckdb *)&local_530,(unsigned_long *)&count_children,&aggregate_index,
               &aggregate_list);
    pLVar18 = unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
              ::operator->((unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                            *)&local_530);
    local_518._M_head_impl = (LogicalOperator *)local_588._M_head_impl;
    local_588._M_head_impl = (BoundConstantExpression *)0x0;
    LogicalOperator::AddChild
              (&pLVar18->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_518);
    if (local_518._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            *)&(local_518._M_head_impl)->_vptr_LogicalOperator)->_M_t).
                         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                         .super__Head_base<0UL,_duckdb::Expression_*,_false> + 8))();
    }
    _Var8._M_head_impl = local_530._M_head_impl;
    _Var6._M_head_impl = local_588._M_head_impl;
    local_518._M_head_impl = (LogicalOperator *)0x0;
    local_530._M_head_impl = (LogicalAggregate *)0x0;
    local_588._M_head_impl = (BoundConstantExpression *)_Var8._M_head_impl;
    if (_Var6._M_head_impl != (BoundConstantExpression *)0x0) {
      (*((_Var6._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
    }
    count_children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)aggregate_index;
    count_children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType&,duckdb::ColumnBinding>
              ((duckdb *)&aggr_index,&idx_type,(ColumnBinding *)&count_children);
    Value::Numeric((Value *)&count_children,&idx_type,1);
    make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
              ((duckdb *)&local_520,(Value *)&count_children);
    Value::~Value((Value *)&count_children);
    count_children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(count_children.
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x19);
    make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<duckdb::BoundColumnRefExpression>,true>,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
              ((duckdb *)&local_528,(ExpressionType *)&count_children,
               (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                *)&aggr_index,
               (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                *)&local_520);
    count_children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_528._M_head_impl;
    projection_list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_528._M_head_impl = (LogicalOperator *)0x0;
    projection_list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    projection_list.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&projection_list,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &count_children);
    if (count_children.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)&((((count_children.
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                   super_BaseExpression).type)();
    }
    projection_index = GenerateTableIndex((Binder *)expr);
    make_uniq<duckdb::LogicalProjection,unsigned_long&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
              ((duckdb *)&local_580,&projection_index,&projection_list);
    pLVar19 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
              ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                            *)&local_580);
    local_570._M_head_impl = (LogicalOperator *)local_588._M_head_impl;
    local_588._M_head_impl = (BoundConstantExpression *)0x0;
    LogicalOperator::AddChild
              (&pLVar19->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_570);
    if ((LogicalAggregate *)local_570._M_head_impl != (LogicalAggregate *)0x0) {
      (*((LogicalOperator *)&(local_570._M_head_impl)->_vptr_LogicalOperator)->_vptr_LogicalOperator
        [1])();
    }
    local_4e8._M_head_impl = local_580._M_head_impl;
    _Var6._M_head_impl = local_588._M_head_impl;
    local_570._M_head_impl = (LogicalOperator *)0x0;
    local_580._M_head_impl = (LogicalProjection *)0x0;
    local_588._M_head_impl = (BoundConstantExpression *)local_4e8._M_head_impl;
    if (_Var6._M_head_impl != (BoundConstantExpression *)0x0) {
      (*((_Var6._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
      local_4e8._M_head_impl = (LogicalProjection *)local_588._M_head_impl;
    }
    local_4e0._M_head_impl =
         (in_RCX->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RCX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    local_588._M_head_impl = (BoundConstantExpression *)0x0;
    LogicalCrossProduct::Create
              ((LogicalCrossProduct *)&count_children,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_4e0,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_4e8);
    puVar24 = count_children.
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    count_children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var28._M_head_impl =
         (in_RCX->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RCX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (LogicalOperator *)puVar24;
    if (_Var28._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var28._M_head_impl)->_vptr_LogicalOperator + 8))();
      if (count_children.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)&((((count_children.
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       )._M_t.
                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                       .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                     super_BaseExpression).type)();
      }
    }
    count_children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    if (local_4e8._M_head_impl != (LogicalProjection *)0x0) {
      (*((local_4e8._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
    }
    local_4e8._M_head_impl = (LogicalProjection *)0x0;
    if (local_4e0._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_4e0._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    local_4e0._M_head_impl = (LogicalOperator *)0x0;
    (*(code *)(((root->
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->expressions)
              .
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)(&count_children,root);
    local_188.table_index = projection_index;
    local_188.column_index = 0;
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalTypeId_const&,duckdb::ColumnBinding>
              ((duckdb *)local_4b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&count_children,
               &LogicalType::BOOLEAN,&local_188);
    _Var28._M_head_impl = (LogicalOperator *)local_4b8;
    local_4b8 = (undefined1  [8])0x0;
    ::std::__cxx11::string::~string((string *)&count_children);
    if (local_580._M_head_impl != (LogicalProjection *)0x0) {
      (*((local_580._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&projection_list);
    if (local_528._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)&(((((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                      &(local_528._M_head_impl)->_vptr_LogicalOperator)->_M_t).
                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                   super_BaseExpression).type)();
    }
    if ((ClientContext *)local_520._M_head_impl != (ClientContext *)0x0) {
      (*(code *)(((((original *)
                   &((local_520._M_head_impl)->super_Expression).super_BaseExpression.
                    _vptr_BaseExpression)->
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)();
    }
    if (aggr_index != 0) {
      (**(code **)(*(long *)aggr_index + 8))();
    }
    if (local_530._M_head_impl != (LogicalAggregate *)0x0) {
      (*((local_530._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&aggregate_list);
    LogicalType::~LogicalType(&idx_type);
    if (function_binder_1.binder.ptr != (Binder *)0x0) {
      (*(code *)((((function_binder_1.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).
                  __weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    AggregateFunction::~AggregateFunction(&count_star_fun);
    if (local_488._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            *)&(local_488._M_head_impl)->_vptr_LogicalOperator)->_M_t).
                         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                         .super__Head_base<0UL,_duckdb::Expression_*,_false> + 8))();
    }
  }
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var28._M_head_impl;
  if (local_588._M_head_impl != (BoundConstantExpression *)0x0) {
    (*((local_588._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
  }
  local_588._M_head_impl = (BoundConstantExpression *)0x0;
LAB_00a62619:
  pBVar13 = shared_ptr<duckdb::Binder,_true>::operator->(&sub_binder);
  if (pBVar13->has_unplanned_dependent_joins == true) {
    count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__RecursiveDependentJoinPlanner_017af228;
    count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_dataplus.
    _M_p = (pointer)0x0;
    count_star_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
    _M_string_length = (size_type)expr;
    op = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
         operator*(in_RCX);
    RecursiveDependentJoinPlanner::VisitOperator
              ((RecursiveDependentJoinPlanner *)&count_star_fun,op);
    RecursiveDependentJoinPlanner::~RecursiveDependentJoinPlanner
              ((RecursiveDependentJoinPlanner *)&count_star_fun);
  }
  if ((element_type *)local_450._0_8_ != (element_type *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_450._0_8_)->__weak_this_).
                internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sub_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> Binder::PlanSubquery(BoundSubqueryExpression &expr, unique_ptr<LogicalOperator> &root) {
	D_ASSERT(root);
	// first we translate the QueryNode of the subquery into a logical plan
	auto sub_binder = Binder::CreateBinder(context, this);
	sub_binder->is_outside_flattened = false;
	auto subquery_root = sub_binder->CreatePlan(*expr.subquery);
	D_ASSERT(subquery_root);

	// now we actually flatten the subquery
	auto plan = std::move(subquery_root);

	unique_ptr<Expression> result_expression;
	if (!expr.IsCorrelated()) {
		result_expression = PlanUncorrelatedSubquery(*this, expr, root, std::move(plan));
	} else {
		result_expression = PlanCorrelatedSubquery(*this, expr, root, std::move(plan));
	}
	// finally, we recursively plan the nested subqueries (if there are any)
	if (sub_binder->has_unplanned_dependent_joins) {
		RecursiveDependentJoinPlanner plan(*this);
		plan.VisitOperator(*root);
	}
	return result_expression;
}